

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O3

void quicly__debug_printf(quicly_conn_t *conn,char *function,int line,char *fmt,...)

{
  char in_AL;
  ulong uVar1;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  char buf [1024];
  undefined8 local_4f8;
  void **local_4f0;
  undefined1 *local_4e8;
  undefined1 local_4d8 [32];
  undefined8 local_4b8;
  undefined8 local_4b0;
  undefined8 local_4a8;
  undefined8 local_498;
  undefined8 local_488;
  undefined8 local_478;
  undefined8 local_468;
  undefined8 local_458;
  undefined8 local_448;
  undefined8 local_438;
  char local_428 [1032];
  
  if (in_AL != '\0') {
    local_4a8 = in_XMM0_Qa;
    local_498 = in_XMM1_Qa;
    local_488 = in_XMM2_Qa;
    local_478 = in_XMM3_Qa;
    local_468 = in_XMM4_Qa;
    local_458 = in_XMM5_Qa;
    local_448 = in_XMM6_Qa;
    local_438 = in_XMM7_Qa;
  }
  if (quicly_trace_fp != (FILE *)0x0) {
    local_4e8 = local_4d8;
    local_4f0 = &args[0].overflow_arg_area;
    local_4f8 = 0x3000000020;
    local_4b8 = in_R8;
    local_4b0 = in_R9;
    vsnprintf(local_428,0x400,fmt,&local_4f8);
    if (conn == (quicly_conn_t *)0x0) {
      uVar1 = 0;
    }
    else {
      uVar1 = (ulong)(conn->super).local.cid_set.plaintext.master_id;
    }
    fprintf((FILE *)quicly_trace_fp,
            "{\"type\":\"debug-message\", \"conn\":%u, \"function\":\"%s\", \"line\":%lld, \"message\":\"%s\"}\n"
            ,uVar1,function,(long)line,local_428);
  }
  return;
}

Assistant:

void quicly__debug_printf(quicly_conn_t *conn, const char *function, int line, const char *fmt, ...)
{
#if QUICLY_USE_EMBEDDED_PROBES || QUICLY_USE_DTRACE
    char buf[1024];
    va_list args;

    if (!QUICLY_DEBUG_MESSAGE_ENABLED())
        return;

    va_start(args, fmt);
    vsnprintf(buf, sizeof(buf), fmt, args);
    va_end(args);

    QUICLY_DEBUG_MESSAGE(conn, function, line, buf);
#endif
}